

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O2

uint16_t wirehair::NextPrime16(uint16_t n)

{
  uint uVar1;
  byte *pbVar2;
  uint16_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  
  if (n < 8) {
    uVar3 = *(uint16_t *)(&DAT_0010a360 + (ulong)n * 2);
  }
  else {
    if (n < 0xfff2) {
      uVar5 = (uint)n + (uint)(byte)kSieveTable[(ushort)((uint)n % 0xd2)];
      uVar8 = (uint)n % 0xd2 + 1 + (uint)(byte)kSieveTable[(ushort)((uint)n % 0xd2)];
      uVar3 = FloorSquareRoot16((uint16_t)uVar5);
      uVar6 = (uint)uVar3;
      uVar4 = (uint)uVar3 * (uint)uVar3;
      do {
        lVar7 = 0;
        do {
          if (lVar7 == 0x32) {
            return (uint16_t)uVar5;
          }
          pbVar2 = &kPrimesUnder256From11 + lVar7;
          if (uVar6 < *pbVar2) {
            return (uint16_t)uVar5;
          }
          lVar7 = lVar7 + 1;
        } while ((short)((uVar5 & 0xffff) % (uint)*pbVar2) != 0);
        uVar1 = uVar8 - 0xd2;
        if (uVar8 < 0xd2) {
          uVar1 = uVar8;
        }
        uVar5 = uVar5 + 1 + (uint)(byte)kSieveTable[uVar1];
        uVar8 = (byte)kSieveTable[uVar1] + 1 + uVar1;
        uVar1 = uVar6 + 1;
        if (uVar4 < (uVar5 & 0xffff)) {
          uVar6 = uVar1;
          uVar4 = uVar1 * uVar1;
        }
      } while( true );
    }
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint16_t NextPrime16(uint16_t n)
{
    // Handle small n
    switch (n)
    {
    case 0:
        CAT_DEBUG_BREAK(); // Invalid input
    case 1: return 1;
    case 2: return 2;
    case 3: return 3;
    case 4:
    case 5: return 5;
    case 6:
    case 7: return 7;
    }

    // Handle large n
    if (n > 65521) {
        CAT_DEBUG_BREAK(); // Invalid input
        return 0;
    }

    // Choose first n from table
    unsigned offset = n % kSieveTableSize;
    uint16_t next = kSieveTable[offset];
    offset += next + 1;
    n += next;

    // Initialize p_max to floor(sqrt(n))
    unsigned p_max = FloorSquareRoot16(n);
    unsigned p_max2 = p_max * p_max;
    const uint8_t * GF256_RESTRICT primes = &kPrimesUnder256From11[0];

    // For each number to try:
TryNext:

    // For each prime to test up to square root:
    for (unsigned i = 0; i < kPrimesUnder256Count; ++i)
    {
        // If the next prime is above p_max we are done!
        const uint8_t p = primes[i];
        if (p > p_max) {
            return n;
        }

        // If composite, try next n
        if (n % p == 0)
        {
            // Use table to choose next trial number
            if (offset >= kSieveTableSize) {
                offset -= kSieveTableSize;
            }

            // Get next to test
            next = kSieveTable[offset];
            offset += next + 1;
            n += next + 1;

            // Derivative square root iteration of p_max
            if (p_max2 < n)
            {
                ++p_max;
                p_max2 = p_max * p_max;
            }

            goto TryNext;
        }
    }

    return n;
}